

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_unitAmericanSpellingOfUnitsRemoved_Test::
~Validator_unitAmericanSpellingOfUnitsRemoved_Test
          (Validator_unitAmericanSpellingOfUnitsRemoved_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unitAmericanSpellingOfUnitsRemoved)
{
    const std::vector<std::string> expectedIssues = {
        "Units reference 'meter' in units 'testunit2' is not a valid reference to a local units or a standard unit type.",
        "Variable 'tomayto' in component 'comp1' has units of 'testunit1' and an equivalent variable 'tomahto' in component 'comp2' with non-matching units of 'testunit2'. The mismatch is: metre^1.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    v1->setName("tomayto");
    v1->setInterfaceType("public");
    v2->setName("tomahto");
    v2->setInterfaceType("public");
    m->setName("callthewholethingoff");
    comp1->addVariable(v1);
    comp2->addVariable(v2);
    comp1->setName("comp1");
    comp2->setName("comp2");
    m->addComponent(comp1);
    m->addComponent(comp2);

    // u1 = u2: different spelling of meter/metre.
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("testunit1");
    u1->addUnit("metre");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("testunit2");
    u2->addUnit("meter");

    v1->setUnits(u1);
    v2->setUnits(u2);
    m->addUnits(u1);
    m->addUnits(u2);

    // This one is now an issue.
    libcellml::Variable::addEquivalence(v1, v2);
    validator->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}